

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextGLImpl.cpp
# Opt level: O3

void __thiscall
Diligent::DeviceContextGLImpl::SetRenderTargetsExt
          (DeviceContextGLImpl *this,SetRenderTargetsAttribs *Attribs)

{
  TextureViewGLImpl *pTVar1;
  ITexture *pIVar2;
  bool bVar3;
  Uint32 UVar4;
  int iVar5;
  undefined4 extraout_var;
  char (*in_R8) [235];
  string msg;
  string local_40;
  
  if ((this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).m_pActiveRenderPass.m_pObject !=
      (RenderPassGLImpl *)0x0) {
    FormatString<char[89]>
              (&local_40,
               (char (*) [89])
               "Calling SetRenderTargets inside active render pass is invalid. End the render pass first"
              );
    DebugAssertionFailed
              (local_40._M_dataplus._M_p,"SetRenderTargetsExt",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
               ,0x1aa);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  bVar3 = DeviceContextBase<Diligent::EngineGLImplTraits>::SetRenderTargets
                    (&this->super_DeviceContextBase<Diligent::EngineGLImplTraits>,Attribs);
  if (!bVar3) {
    return;
  }
  UVar4 = (this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).m_NumBoundRenderTargets;
  if (UVar4 == 1) {
    pTVar1 = (this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).m_pBoundRenderTargets[0].
             m_pObject;
    if (pTVar1 != (TextureViewGLImpl *)0x0) {
      pIVar2 = (pTVar1->super_TextureViewBase<Diligent::EngineGLImplTraits>).m_pTexture;
      if (pIVar2 != (ITexture *)0x0) {
        CheckDynamicType<Diligent::TextureBaseGL,Diligent::ITexture>(pIVar2);
      }
      if (*(int *)((long)&pIVar2[0x14].super_IDeviceObject.super_IObject._vptr_IObject + 4) == 0) {
        pTVar1 = (this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).m_pBoundDepthStencil.
                 m_pObject;
        bVar3 = true;
        if (pTVar1 != (TextureViewGLImpl *)0x0) {
          pIVar2 = (pTVar1->super_TextureViewBase<Diligent::EngineGLImplTraits>).m_pTexture;
          if (pIVar2 != (ITexture *)0x0) {
            CheckDynamicType<Diligent::TextureBaseGL,Diligent::ITexture>(pIVar2);
          }
          if (*(int *)((long)&pIVar2[0x14].super_IDeviceObject.super_IObject._vptr_IObject + 4) != 0
             ) {
            iVar5 = (*(((((this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).
                          m_pBoundDepthStencil.m_pObject)->
                        super_TextureViewBase<Diligent::EngineGLImplTraits>).m_pTexture)->
                      super_IDeviceObject).super_IObject._vptr_IObject[4])();
            FormatString<char[29],char_const*,char[235]>
                      (&local_40,(Diligent *)"Attempting to bind texture \'",
                       (char (*) [29])CONCAT44(extraout_var,iVar5),
                       (char **)
                       "\' as depth buffer with the default framebuffer\'s color buffer: color buffer of the default framebuffer can only be bound with the default framebuffer\'s depth buffer and cannot be combined with any other depth buffer in OpenGL backend."
                       ,in_R8);
            DebugAssertionFailed
                      (local_40._M_dataplus._M_p,"SetRenderTargetsExt",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
                       ,0x1b3);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_40._M_dataplus._M_p != &local_40.field_2) {
              operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
            }
          }
        }
        goto LAB_00326249;
      }
      UVar4 = (this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).m_NumBoundRenderTargets;
      goto LAB_00326243;
    }
  }
  else {
LAB_00326243:
    if ((UVar4 == 0) &&
       (pTVar1 = (this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).m_pBoundDepthStencil.
                 m_pObject, pTVar1 != (TextureViewGLImpl *)0x0)) {
      pIVar2 = (pTVar1->super_TextureViewBase<Diligent::EngineGLImplTraits>).m_pTexture;
      if (pIVar2 != (ITexture *)0x0) {
        CheckDynamicType<Diligent::TextureBaseGL,Diligent::ITexture>(pIVar2);
      }
      if (*(int *)((long)&pIVar2[0x14].super_IDeviceObject.super_IObject._vptr_IObject + 4) == 0) {
        bVar3 = true;
        goto LAB_00326249;
      }
    }
  }
  bVar3 = false;
LAB_00326249:
  this->m_IsDefaultFBOBound = bVar3;
  CommitRenderTargets(this);
  return;
}

Assistant:

void DeviceContextGLImpl::SetRenderTargetsExt(const SetRenderTargetsAttribs& Attribs)
{
    DEV_CHECK_ERR(m_pActiveRenderPass == nullptr, "Calling SetRenderTargets inside active render pass is invalid. End the render pass first");

    if (TDeviceContextBase::SetRenderTargets(Attribs))
    {
        if (m_NumBoundRenderTargets == 1 && m_pBoundRenderTargets[0] && m_pBoundRenderTargets[0]->GetTexture<TextureBaseGL>()->GetGLHandle() == 0)
        {
            DEV_CHECK_ERR(!m_pBoundDepthStencil || m_pBoundDepthStencil->GetTexture<TextureBaseGL>()->GetGLHandle() == 0,
                          "Attempting to bind texture '", m_pBoundDepthStencil->GetTexture()->GetDesc().Name,
                          "' as depth buffer with the default framebuffer's color buffer: color buffer of the default framebuffer "
                          "can only be bound with the default framebuffer's depth buffer and cannot be combined with any other depth buffer in OpenGL backend.");
            m_IsDefaultFBOBound = true;
        }
        else if (m_NumBoundRenderTargets == 0 && m_pBoundDepthStencil && m_pBoundDepthStencil->GetTexture<TextureBaseGL>()->GetGLHandle() == 0)
        {
            m_IsDefaultFBOBound = true;
        }
        else
        {
            m_IsDefaultFBOBound = false;
        }

        CommitRenderTargets();
    }
}